

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaNormalTargetGenerator.cxx
# Opt level: O0

void __thiscall
cmNinjaNormalTargetGenerator::WriteDeviceLinkRule
          (cmNinjaNormalTargetGenerator *this,bool useResponseFile)

{
  bool bVar1;
  TargetType TVar2;
  TargetType targetType_00;
  int iVar3;
  cmGeneratorTarget *pcVar4;
  cmGlobalNinjaGenerator *pcVar5;
  cmMakefile *this_00;
  cmLocalNinjaGenerator *pcVar6;
  char *pcVar7;
  undefined4 extraout_var;
  reference pbVar8;
  cmRulePlaceholderExpander *this_01;
  ostream *poVar9;
  cmOutputConverter *local_728;
  allocator local_669;
  string local_668;
  allocator local_641;
  string local_640;
  allocator local_619;
  string local_618;
  string local_5f8;
  string local_5d8;
  undefined1 local_5b8 [8];
  ostringstream description;
  undefined1 local_440 [8];
  ostringstream comment;
  undefined1 local_2c8 [8];
  string linkCmd;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a0;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_280;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_278;
  iterator i;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  linkCmds;
  auto_ptr<cmRulePlaceholderExpander> rulePlaceholderExpander;
  string local_248;
  char *local_228;
  char *val;
  string launcher;
  string langFlags;
  char *flag;
  string cmakeLinkVar;
  undefined1 local_1b0 [8];
  string cmakeVarLang;
  string responseFlag;
  RuleVariables vars;
  undefined1 local_78 [8];
  string rspcontent;
  string rspfile;
  string ruleName;
  TargetType targetType;
  bool useResponseFile_local;
  cmNinjaNormalTargetGenerator *this_local;
  
  pcVar4 = cmNinjaTargetGenerator::GetGeneratorTarget(&this->super_cmNinjaTargetGenerator);
  TVar2 = cmGeneratorTarget::GetType(pcVar4);
  LanguageLinkerDeviceRule_abi_cxx11_((string *)((long)&rspfile.field_2 + 8),this);
  std::__cxx11::string::string((string *)(rspcontent.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)local_78);
  pcVar5 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
  bVar1 = cmGlobalNinjaGenerator::HasRule(pcVar5,(string *)((long)&rspfile.field_2 + 8));
  if (!bVar1) {
    cmRulePlaceholderExpander::RuleVariables::RuleVariables
              ((RuleVariables *)((long)&responseFlag.field_2 + 8));
    pcVar4 = cmNinjaTargetGenerator::GetGeneratorTarget(&this->super_cmNinjaTargetGenerator);
    cmGeneratorTarget::GetName_abi_cxx11_(pcVar4);
    responseFlag.field_2._8_8_ = std::__cxx11::string::c_str();
    pcVar4 = cmNinjaTargetGenerator::GetGeneratorTarget(&this->super_cmNinjaTargetGenerator);
    targetType_00 = cmGeneratorTarget::GetType(pcVar4);
    cmState::GetTargetTypeName(targetType_00);
    std::__cxx11::string::string((string *)(cmakeVarLang.field_2._M_local_buf + 8));
    if (useResponseFile) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)local_1b0,"CMAKE_",(allocator *)(cmakeLinkVar.field_2._M_local_buf + 0xf)
                );
      std::allocator<char>::~allocator((allocator<char> *)(cmakeLinkVar.field_2._M_local_buf + 0xf))
      ;
      std::__cxx11::string::operator+=((string *)local_1b0,(string *)&this->TargetLinkLanguage);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&flag,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b0,
                     "_RESPONSE_FILE_LINK_FLAG");
      this_00 = cmNinjaTargetGenerator::GetMakefile(&this->super_cmNinjaTargetGenerator);
      pcVar7 = cmMakefile::GetDefinition(this_00,(string *)&flag);
      if (pcVar7 == (char *)0x0) {
        std::__cxx11::string::operator=((string *)(cmakeVarLang.field_2._M_local_buf + 8),"@");
      }
      else {
        std::__cxx11::string::operator=((string *)(cmakeVarLang.field_2._M_local_buf + 8),pcVar7);
      }
      std::__cxx11::string::operator=((string *)(rspcontent.field_2._M_local_buf + 8),"$RSP_FILE");
      std::__cxx11::string::operator+=
                ((string *)(cmakeVarLang.field_2._M_local_buf + 8),
                 (string *)(rspcontent.field_2._M_local_buf + 8));
      pcVar5 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
      bVar1 = cmGlobalNinjaGenerator::IsGCCOnWindows(pcVar5);
      if (bVar1) {
        std::__cxx11::string::operator=((string *)local_78,"$in");
      }
      else {
        std::__cxx11::string::operator=((string *)local_78,"$in_newline");
      }
      std::__cxx11::string::operator+=((string *)local_78," $LINK_LIBRARIES");
      std::__cxx11::string::c_str();
      std::__cxx11::string::~string((string *)&flag);
      std::__cxx11::string::~string((string *)local_1b0);
    }
    std::__cxx11::string::string((string *)(launcher.field_2._M_local_buf + 8));
    if (TVar2 != EXECUTABLE) {
      std::__cxx11::string::operator+=
                ((string *)(launcher.field_2._M_local_buf + 8),"$LANGUAGE_COMPILE_FLAGS $ARCH_FLAGS"
                );
      std::__cxx11::string::c_str();
    }
    std::__cxx11::string::string((string *)&val);
    pcVar6 = cmNinjaTargetGenerator::GetLocalGenerator(&this->super_cmNinjaTargetGenerator);
    pcVar4 = cmNinjaTargetGenerator::GetGeneratorTarget(&this->super_cmNinjaTargetGenerator);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_248,"RULE_LAUNCH_LINK",
               (allocator *)((long)&rulePlaceholderExpander.x_ + 7));
    pcVar7 = cmLocalGenerator::GetRuleLauncher((cmLocalGenerator *)pcVar6,pcVar4,&local_248);
    std::__cxx11::string::~string((string *)&local_248);
    std::allocator<char>::~allocator((allocator<char> *)((long)&rulePlaceholderExpander.x_ + 7));
    local_228 = pcVar7;
    if ((pcVar7 != (char *)0x0) && (*pcVar7 != '\0')) {
      std::__cxx11::string::operator=((string *)&val,pcVar7);
      std::__cxx11::string::operator+=((string *)&val," ");
    }
    pcVar6 = cmNinjaTargetGenerator::GetLocalGenerator(&this->super_cmNinjaTargetGenerator);
    iVar3 = (*(pcVar6->super_cmLocalCommonGenerator).super_cmLocalGenerator._vptr_cmLocalGenerator
              [5])();
    ::cm::auto_ptr<cmRulePlaceholderExpander>::auto_ptr
              ((auto_ptr<cmRulePlaceholderExpander> *)
               &linkCmds.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,
               (cmRulePlaceholderExpander *)CONCAT44(extraout_var,iVar3));
    ComputeDeviceLinkCmd_abi_cxx11_
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&i,this);
    local_278._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&i);
    while( true ) {
      local_280._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&i);
      bVar1 = __gnu_cxx::operator!=(&local_278,&local_280);
      if (!bVar1) break;
      pbVar8 = __gnu_cxx::
               __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&local_278);
      std::operator+(&local_2a0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&val,
                     pbVar8);
      pbVar8 = __gnu_cxx::
               __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&local_278);
      std::__cxx11::string::operator=((string *)pbVar8,(string *)&local_2a0);
      std::__cxx11::string::~string((string *)&local_2a0);
      this_01 = ::cm::auto_ptr<cmRulePlaceholderExpander>::operator->
                          ((auto_ptr<cmRulePlaceholderExpander> *)
                           &linkCmds.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
      pcVar6 = cmNinjaTargetGenerator::GetLocalGenerator(&this->super_cmNinjaTargetGenerator);
      local_728 = (cmOutputConverter *)0x0;
      if (pcVar6 != (cmLocalNinjaGenerator *)0x0) {
        local_728 = &(pcVar6->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                     super_cmOutputConverter;
      }
      pbVar8 = __gnu_cxx::
               __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&local_278);
      cmRulePlaceholderExpander::ExpandRuleVariables
                (this_01,local_728,pbVar8,(RuleVariables *)((long)&responseFlag.field_2 + 8));
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_278);
    }
    cmEraseIf<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,cmNinjaRemoveNoOpCommands>
              (&i);
    pcVar6 = cmNinjaTargetGenerator::GetLocalGenerator(&this->super_cmNinjaTargetGenerator);
    cmLocalNinjaGenerator::BuildCommandLine
              ((string *)local_2c8,pcVar6,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&i);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_440);
    poVar9 = std::operator<<((ostream *)local_440,"Rule for linking ");
    poVar9 = std::operator<<(poVar9,(string *)&this->TargetLinkLanguage);
    poVar9 = std::operator<<(poVar9," ");
    pcVar7 = GetVisibleTypeName(this);
    poVar9 = std::operator<<(poVar9,pcVar7);
    std::operator<<(poVar9,".");
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_5b8);
    poVar9 = std::operator<<((ostream *)local_5b8,"Linking ");
    poVar9 = std::operator<<(poVar9,(string *)&this->TargetLinkLanguage);
    poVar9 = std::operator<<(poVar9," ");
    pcVar7 = GetVisibleTypeName(this);
    poVar9 = std::operator<<(poVar9,pcVar7);
    std::operator<<(poVar9," $TARGET_FILE");
    pcVar5 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
    std::__cxx11::ostringstream::str();
    std::__cxx11::ostringstream::str();
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_618,"",&local_619);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_640,"",&local_641);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_668,"$RESTAT",&local_669);
    cmGlobalNinjaGenerator::AddRule
              (pcVar5,(string *)((long)&rspfile.field_2 + 8),(string *)local_2c8,&local_5d8,
               &local_5f8,&local_618,&local_640,(string *)((long)&rspcontent.field_2 + 8),
               (string *)local_78,&local_668,false);
    std::__cxx11::string::~string((string *)&local_668);
    std::allocator<char>::~allocator((allocator<char> *)&local_669);
    std::__cxx11::string::~string((string *)&local_640);
    std::allocator<char>::~allocator((allocator<char> *)&local_641);
    std::__cxx11::string::~string((string *)&local_618);
    std::allocator<char>::~allocator((allocator<char> *)&local_619);
    std::__cxx11::string::~string((string *)&local_5f8);
    std::__cxx11::string::~string((string *)&local_5d8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5b8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_440);
    std::__cxx11::string::~string((string *)local_2c8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&i);
    ::cm::auto_ptr<cmRulePlaceholderExpander>::~auto_ptr
              ((auto_ptr<cmRulePlaceholderExpander> *)
               &linkCmds.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::__cxx11::string::~string((string *)&val);
    std::__cxx11::string::~string((string *)(launcher.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(cmakeVarLang.field_2._M_local_buf + 8));
  }
  std::__cxx11::string::~string((string *)local_78);
  std::__cxx11::string::~string((string *)(rspcontent.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(rspfile.field_2._M_local_buf + 8));
  return;
}

Assistant:

void cmNinjaNormalTargetGenerator::WriteDeviceLinkRule(bool useResponseFile)
{
  cmStateEnums::TargetType targetType = this->GetGeneratorTarget()->GetType();
  std::string ruleName = this->LanguageLinkerDeviceRule();
  // Select whether to use a response file for objects.
  std::string rspfile;
  std::string rspcontent;

  if (!this->GetGlobalGenerator()->HasRule(ruleName)) {
    cmRulePlaceholderExpander::RuleVariables vars;
    vars.CMTargetName = this->GetGeneratorTarget()->GetName().c_str();
    vars.CMTargetType =
      cmState::GetTargetTypeName(this->GetGeneratorTarget()->GetType());

    vars.Language = "CUDA";

    std::string responseFlag;
    if (!useResponseFile) {
      vars.Objects = "$in";
      vars.LinkLibraries = "$LINK_LIBRARIES";
    } else {
      std::string cmakeVarLang = "CMAKE_";
      cmakeVarLang += this->TargetLinkLanguage;

      // build response file name
      std::string cmakeLinkVar = cmakeVarLang + "_RESPONSE_FILE_LINK_FLAG";
      const char* flag = GetMakefile()->GetDefinition(cmakeLinkVar);
      if (flag) {
        responseFlag = flag;
      } else {
        responseFlag = "@";
      }
      rspfile = "$RSP_FILE";
      responseFlag += rspfile;

      // build response file content
      if (this->GetGlobalGenerator()->IsGCCOnWindows()) {
        rspcontent = "$in";
      } else {
        rspcontent = "$in_newline";
      }
      rspcontent += " $LINK_LIBRARIES";
      vars.Objects = responseFlag.c_str();
      vars.LinkLibraries = "";
    }

    vars.ObjectDir = "$OBJECT_DIR";

    vars.Target = "$TARGET_FILE";

    vars.SONameFlag = "$SONAME_FLAG";
    vars.TargetSOName = "$SONAME";
    vars.TargetPDB = "$TARGET_PDB";
    vars.TargetCompilePDB = "$TARGET_COMPILE_PDB";

    vars.Flags = "$FLAGS";
    vars.LinkFlags = "$LINK_FLAGS";
    vars.Manifests = "$MANIFESTS";

    std::string langFlags;
    if (targetType != cmStateEnums::EXECUTABLE) {
      langFlags += "$LANGUAGE_COMPILE_FLAGS $ARCH_FLAGS";
      vars.LanguageCompileFlags = langFlags.c_str();
    }

    std::string launcher;
    const char* val = this->GetLocalGenerator()->GetRuleLauncher(
      this->GetGeneratorTarget(), "RULE_LAUNCH_LINK");
    if (val && *val) {
      launcher = val;
      launcher += " ";
    }

    CM_AUTO_PTR<cmRulePlaceholderExpander> rulePlaceholderExpander(
      this->GetLocalGenerator()->CreateRulePlaceholderExpander());

    // Rule for linking library/executable.
    std::vector<std::string> linkCmds = this->ComputeDeviceLinkCmd();
    for (std::vector<std::string>::iterator i = linkCmds.begin();
         i != linkCmds.end(); ++i) {
      *i = launcher + *i;
      rulePlaceholderExpander->ExpandRuleVariables(this->GetLocalGenerator(),
                                                   *i, vars);
    }

    // If there is no ranlib the command will be ":".  Skip it.
    cmEraseIf(linkCmds, cmNinjaRemoveNoOpCommands());

    std::string linkCmd =
      this->GetLocalGenerator()->BuildCommandLine(linkCmds);

    // Write the linker rule with response file if needed.
    std::ostringstream comment;
    comment << "Rule for linking " << this->TargetLinkLanguage << " "
            << this->GetVisibleTypeName() << ".";
    std::ostringstream description;
    description << "Linking " << this->TargetLinkLanguage << " "
                << this->GetVisibleTypeName() << " $TARGET_FILE";
    this->GetGlobalGenerator()->AddRule(ruleName, linkCmd, description.str(),
                                        comment.str(),
                                        /*depfile*/ "",
                                        /*deptype*/ "", rspfile, rspcontent,
                                        /*restat*/ "$RESTAT",
                                        /*generator*/ false);
  }
}